

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool square_remove_trap(chunk *c,loc grid,trap *trap,_Bool memorize)

{
  trap *trap_00;
  trap *ptVar1;
  _Bool _Var2;
  square *psVar3;
  trap *ptVar4;
  trap *ptVar5;
  
  psVar3 = square((chunk_conflict *)c,grid);
  ptVar1 = (trap *)0x0;
  trap_00 = psVar3->trap;
  do {
    ptVar5 = trap_00;
    ptVar4 = ptVar1;
    if (ptVar5 == (trap *)0x0) goto LAB_001c44c9;
    trap_00 = trap->next;
    ptVar1 = trap;
  } while (ptVar5 != trap);
  _Var2 = loc_eq((loc_conflict)grid,(loc_conflict)trap->grid);
  if (!_Var2) {
    __assert_fail("loc_eq(grid, trap->grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/trap.c"
                  ,0x98,"_Bool square_remove_trap(struct chunk *, struct loc, struct trap *, _Bool)"
                 );
  }
  mem_free(trap);
  if (ptVar4 == (trap *)0x0) {
    square_set_trap((chunk_conflict *)c,grid,trap_00);
    if (trap_00 == (trap *)0x0) {
      psVar3 = square((chunk_conflict *)c,grid);
      flag_off(psVar3->info,3,9);
    }
  }
  else {
    ptVar4->next = trap_00;
  }
  if (memorize) {
    _Var2 = square_isseen(cave,grid);
    if (_Var2) {
      square_memorize_traps((chunk *)cave,grid);
      square_light_spot((chunk *)cave,grid);
    }
  }
LAB_001c44c9:
  return ptVar5 != (trap *)0x0;
}

Assistant:

bool square_remove_trap(struct chunk *c, struct loc grid, struct trap *trap,
		bool memorize)
{
	struct trap *cursor = square(c, grid)->trap;
	struct trap *prev_trap = NULL;
	bool removed = false;

	while (cursor) {
		struct trap *next_trap = trap->next;

		if (cursor == trap) {
			assert(loc_eq(grid, trap->grid));
			removed = true;
			mem_free(trap);
			if (prev_trap) {
				prev_trap->next = next_trap;
			} else {
				square_set_trap(c, grid, next_trap);
				if (!next_trap) {
					/* There are no more traps here. */
					sqinfo_off(square(c, grid)->info,
						SQUARE_TRAP);
				}
			}
			/* Refresh grids that the character can see */
			if (memorize && square_isseen(cave, grid)) {
				square_memorize_traps(cave, grid);
				square_light_spot(cave, grid);
			}
			break;
		}
		prev_trap = trap;
		cursor = next_trap;
	}

	return removed;
}